

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_24b93bd::ObmcSadHBDTest_ExtremeValues_Test::TestBody
          (ObmcSadHBDTest_ExtremeValues_Test *this)

{
  undefined8 *puVar1;
  uchar *puVar2;
  ObmcSadHBDTest_ExtremeValues_Test *pOVar3;
  bool bVar4;
  long lVar5;
  SEARCH_METHODS *message;
  int iVar6;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  uint tst_res;
  uint ref_res;
  RegisterStateCheckMMX reg_check_mmx;
  uint16_t pre [16384];
  int32_t mask [16384];
  int32_t wsrc [16384];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_280a8;
  AssertHelper AStack_280a0;
  uint uStack_28098;
  uint uStack_28094;
  internal aiStack_28090 [8];
  undefined2 uStack_28088;
  undefined2 uStack_28086;
  undefined4 uStack_28084;
  undefined2 uStack_28080;
  uchar *puStack_28070;
  ObmcSadHBDTest_ExtremeValues_Test *pOStack_28068;
  undefined8 auStack_28060 [4096];
  int aiStack_20060 [32780];
  
  puStack_28070 = (uchar *)((ulong)auStack_28060 >> 1);
  iVar6 = 0;
  pOStack_28068 = this;
  while( true ) {
    bVar4 = testing::Test::HasFatalFailure();
    pOVar3 = pOStack_28068;
    puVar2 = puStack_28070;
    if (bVar4) {
      return;
    }
    lVar5 = 0;
    do {
      *(undefined8 *)((long)auStack_28060 + lVar5 * 2) = 0xfff0fff0fff0fff;
      aiStack_20060[lVar5 + 0x4000] = 0xfff000;
      aiStack_20060[lVar5 + 0x4001] = 0xfff000;
      aiStack_20060[lVar5 + 0x4002] = 0xfff000;
      aiStack_20060[lVar5 + 0x4003] = 0xfff000;
      aiStack_20060[lVar5] = 0x1000;
      aiStack_20060[lVar5 + 1] = 0x1000;
      aiStack_20060[lVar5 + 2] = 0x1000;
      aiStack_20060[lVar5 + 3] = 0x1000;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x4000);
    uStack_28094 = (*(pOStack_28068->super_ObmcSadHBDTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
                     .params_.ref_func)(puStack_28070,iVar6,aiStack_20060 + 0x4000,aiStack_20060);
    aiStack_28090[0] = SUB21(in_FPUControlWord,0);
    uStack_28084 = (undefined4)in_FPUInstructionPointer;
    uStack_28080 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    uStack_28088 = in_FPUTagWord;
    uStack_28098 = (*(pOVar3->super_ObmcSadHBDTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
                     .params_.tst_func)(puVar2,iVar6,aiStack_20060 + 0x4000,aiStack_20060);
    libaom_test::RegisterStateCheckMMX::Check((RegisterStateCheckMMX *)aiStack_28090);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (aiStack_28090,"ref_res","tst_res",&uStack_28094,&uStack_28098);
    if (aiStack_28090[0] == (internal)0x0) break;
    puVar1 = (undefined8 *)CONCAT44(uStack_28084,CONCAT22(uStack_28086,uStack_28088));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    iVar6 = iVar6 + 1;
    if (iVar6 == 0x80) {
      return;
    }
  }
  testing::Message::Message((Message *)&_Stack_280a8);
  puVar1 = (undefined8 *)CONCAT44(uStack_28084,CONCAT22(uStack_28086,uStack_28088));
  if (puVar1 == (undefined8 *)0x0) {
    message = "";
  }
  else {
    message = (SEARCH_METHODS *)*puVar1;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_280a0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/obmc_sad_test.cc"
             ,0xeb,(char *)message);
  testing::internal::AssertHelper::operator=(&AStack_280a0,(Message *)&_Stack_280a8);
  testing::internal::AssertHelper::~AssertHelper(&AStack_280a0);
  if (_Stack_280a8._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)_Stack_280a8._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  puVar1 = (undefined8 *)CONCAT44(uStack_28084,CONCAT22(uStack_28086,uStack_28088));
  if (puVar1 == (undefined8 *)0x0) {
    return;
  }
  if ((undefined8 *)*puVar1 != puVar1 + 2) {
    operator_delete((undefined8 *)*puVar1);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

TEST_P(ObmcSadHBDTest, ExtremeValues) {
  DECLARE_ALIGNED(32, uint16_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < MAX_SB_SIZE && !HasFatalFailure(); ++iter) {
    const int pre_stride = iter;

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = (1 << 12) - 1;
      wsrc[i] = ((1 << 12) - 1) * kMaskMax * kMaskMax;
      mask[i] = kMaskMax * kMaskMax;
    }

    const unsigned int ref_res =
        params_.ref_func(CONVERT_TO_BYTEPTR(pre), pre_stride, wsrc, mask);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(
        tst_res =
            params_.tst_func(CONVERT_TO_BYTEPTR(pre), pre_stride, wsrc, mask));

    ASSERT_EQ(ref_res, tst_res);
  }
}